

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontSym.cpp
# Opt level: O1

void __thiscall
TPZFrontSym<long_double>::ExtractFrontMatrix
          (TPZFrontSym<long_double> *this,TPZFMatrix<long_double> *front)

{
  long lVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long local_68;
  long local_50;
  
  lVar1 = (this->super_TPZFront<long_double>).fLocal.fNElements;
  if (lVar1 < 1) {
    lVar9 = 0;
  }
  else {
    lVar8 = 0;
    do {
      lVar9 = lVar8;
      if ((this->super_TPZFront<long_double>).fLocal.fStore[lVar8] != -1) break;
      lVar8 = lVar8 + 1;
      lVar9 = lVar1;
    } while (lVar1 != lVar8);
  }
  (*(front->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xe]
  )(front,lVar1 - lVar9);
  if (lVar9 < lVar1) {
    local_50 = 0;
    local_68 = 0;
    lVar8 = lVar9;
    do {
      if ((this->super_TPZFront<long_double>).fLocal.fStore[lVar8] != -1) {
        lVar10 = lVar8 - lVar9;
        lVar6 = local_68;
        lVar7 = local_50;
        do {
          plVar2 = (this->super_TPZFront<long_double>).fLocal.fStore;
          lVar4 = plVar2[lVar9 + lVar7];
          if (lVar4 != -1) {
            lVar3 = plVar2[lVar8];
            lVar5 = lVar4;
            if (lVar4 < lVar3) {
              lVar5 = lVar3;
            }
            if (lVar3 < lVar4) {
              lVar4 = lVar3;
            }
            lVar5 = (lVar5 + 1) * lVar5;
            if ((((lVar10 < 0) ||
                 ((front->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow <= lVar10)) ||
                (lVar7 < 0)) ||
               ((front->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol <= lVar7)) {
              TPZFMatrix<long_double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds")
              ;
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar3 = (front->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
            front->fElem[lVar3 * lVar7 + lVar10] =
                 *(longdouble *)
                  ((long)(this->super_TPZFront<long_double>).fData.fStore +
                  lVar4 * 0x10 + (lVar5 - (lVar5 >> 0x3f) & 0xfffffffffffffffeU) * 8);
            if (((lVar3 <= lVar10 || lVar10 < 0) || (lVar7 < 0)) ||
               ((front->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol <= lVar7)) {
              TPZFMatrix<long_double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds")
              ;
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar4 = (front->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
            if (((lVar7 < 0 || lVar4 <= lVar7) || (lVar10 < 0)) ||
               ((front->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol <= lVar10)) {
              TPZFMatrix<long_double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds")
              ;
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            *(longdouble *)
             ((long)front->fElem +
             lVar6 + (front->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow * local_68) =
                 front->fElem[lVar4 * lVar7 + lVar10];
          }
          lVar6 = lVar6 + 0x10;
          lVar4 = lVar9 + lVar7;
          lVar7 = lVar7 + 1;
        } while (lVar4 + 1 < lVar1);
      }
      lVar8 = lVar8 + 1;
      local_68 = local_68 + 0x10;
      local_50 = local_50 + 1;
    } while (lVar8 != lVar1);
  }
  return;
}

Assistant:

void TPZFrontSym<TVar>::ExtractFrontMatrix(TPZFMatrix<TVar> &front)
{
	int64_t maxeq = this->fLocal.NElements();
	int64_t mineq = 0;
	for(mineq=0; mineq<maxeq; mineq++) if(this->fLocal[mineq] != -1) break;
	int64_t numeq = maxeq-mineq;
	front.Redim(numeq,numeq);
	int64_t ieq,jeq;
	for(ieq=mineq;ieq<maxeq;ieq++) {
		if(this->fLocal[ieq] == -1) continue;
		int64_t il = ieq-mineq;
		for(jeq=ieq;jeq<maxeq;jeq++) {
			if(this->fLocal[jeq] == -1) continue;
			int64_t jl = jeq-mineq;
			front(il,jl) = this->Element(this->fLocal[ieq],this->fLocal[jeq]);
			front(jl,il) = front(il,jl);
		}
	}
	
}